

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

string * get_file(string *__return_storage_ptr__,string *message)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  FileManager *this;
  string data;
  string local_70;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  this = (FileManager *)operator_new(0x20);
  paVar1 = &(this->HOME_DIR).field_2;
  (this->HOME_DIR)._M_dataplus._M_p = (pointer)paVar1;
  (this->HOME_DIR).field_2._M_allocated_capacity = 0x69702f656d6f682f;
  *(undefined2 *)((long)&(this->HOME_DIR).field_2 + 8) = 0x2f;
  (this->HOME_DIR)._M_string_length = 9;
  local_48 = 0;
  local_40 = 0;
  pcVar2 = (message->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_50 = &local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + message->_M_string_length);
  FileManager::get_file(__return_storage_ptr__,this,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = (this->HOME_DIR)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x20);
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_file(const std::string &message) {
    auto f = new FileManager;
    std::string data;
    auto result = f->get_file(message);
    delete f;
    return result;
}